

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O3

void xercesc_4_0::XTemplateSerializer::loadObject
               (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> **objToLoad,int initSize,
               bool toCallDestructor,XSerializeEngine *serEng)

{
  XMLSize_t XVar1;
  bool bVar2;
  MemoryManager *pMVar3;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *pVVar4;
  SchemaElementDecl **__s;
  ssize_t sVar5;
  XSerializeEngine *__nbytes;
  void *extraout_RDX;
  void *__buf;
  ulong uVar6;
  XMLSize_t vectorSize;
  XMLSize_t local_38;
  
  __nbytes = serEng;
  bVar2 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar2) {
    pVVar4 = *objToLoad;
    if (pVVar4 == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
      pMVar3 = XSerializeEngine::getMemoryManager(serEng);
      pVVar4 = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)XMemory::operator_new(0x28,pMVar3)
      ;
      pMVar3 = XSerializeEngine::getMemoryManager(serEng);
      uVar6 = 0x10;
      if (-1 < initSize) {
        uVar6 = (ulong)(uint)initSize;
      }
      pVVar4->fCallDestructor = toCallDestructor;
      pVVar4->fCurCount = 0;
      pVVar4->fMaxCount = uVar6;
      pVVar4->fElemList = (SchemaElementDecl **)0x0;
      pVVar4->fMemoryManager = pMVar3;
      __nbytes = (XSerializeEngine *)pMVar3->_vptr_MemoryManager;
      __s = (SchemaElementDecl **)(*(code *)__nbytes->fOutputStream)(pMVar3);
      pVVar4->fElemList = __s;
      memset(__s,0,pVVar4->fMaxCount << 3);
      *objToLoad = pVVar4;
    }
    XSerializeEngine::registerObject(serEng,pVVar4);
    local_38 = 0;
    XSerializeEngine::readSize(serEng,&local_38);
    if (local_38 != 0) {
      uVar6 = 0;
      __buf = extraout_RDX;
      do {
        sVar5 = XSerializeEngine::read(serEng,0x439a60,__buf,(size_t)__nbytes);
        pVVar4 = *objToLoad;
        ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ensureExtraCapacity(pVVar4,1);
        XVar1 = pVVar4->fCurCount;
        __nbytes = (XSerializeEngine *)pVVar4->fElemList;
        __buf = (void *)(XVar1 + 1);
        pVVar4->fCurCount = (XMLSize_t)__buf;
        *(ssize_t *)(&__nbytes->fStoreLoad + XVar1 * 4) = sVar5;
        uVar6 = uVar6 + 1;
      } while (uVar6 < local_38);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(ValueVectorOf<SchemaElementDecl*>**       objToLoad
                                   , int                                       initSize
                                   , bool                                      toCallDestructor
                                   , XSerializeEngine&                         serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        if (!*objToLoad)
        {
            if (initSize < 0)
                initSize = 16;

            *objToLoad = new (serEng.getMemoryManager())
                             ValueVectorOf<SchemaElementDecl*>(
                                                               initSize
                                                             , serEng.getMemoryManager()
                                                             , toCallDestructor
                                                             );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t vectorSize = 0;
        serEng.readSize (vectorSize);

        for (XMLSize_t i = 0; i < vectorSize; i++)
        {
            SchemaElementDecl* data;
            serEng>>data;
            (*objToLoad)->addElement(data);
        }
    }
}